

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bidi.c
# Opt level: O2

wchar_t do_shape(bidi_char *line,bidi_char *to,wchar_t count)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  wchar_t wVar5;
  uint uVar6;
  wchar_t wVar7;
  undefined *puVar8;
  uint uVar9;
  undefined4 uVar10;
  long lVar11;
  
  lVar3 = 0;
  uVar4 = 0;
  if (L'\0' < count) {
    uVar4 = (ulong)(uint)count;
  }
  wVar5 = L'\x01';
  do {
    if (uVar4 * 0xc - lVar3 == 0) {
      return L'\x01';
    }
    *(undefined4 *)((long)&to->index + lVar3) = *(undefined4 *)((long)&line->index + lVar3);
    *(undefined8 *)((long)&to->origwc + lVar3) = *(undefined8 *)((long)&line->origwc + lVar3);
    iVar2 = *(int *)((long)&line->wc + lVar3);
    uVar1 = iVar2 - 0x621;
    if (uVar1 < 0xb2) {
      if (shapetypes[uVar1].type == '\x02') {
        uVar6 = 3;
        if (wVar5 < count) {
          uVar9 = *(int *)((long)&line[1].wc + lVar3) - 0x621;
          uVar6 = 3;
          if (uVar9 < 0xb2) {
            uVar6 = (uint)shapetypes[uVar9].type;
          }
        }
        if (lVar3 == 0 || iVar2 != 0x644) {
switchD_001124ec_caseD_624:
          if ((uVar6 < 5) && ((0x15U >> (uVar6 & 0x1f) & 1) != 0)) {
            if (((lVar3 == 0) || (uVar6 = *(int *)((long)line + lVar3 + -8) - 0x621, 0xb1 < uVar6))
               || ((4 < (byte)shapetypes[uVar6].type ||
                   ((0x16U >> ((byte)shapetypes[uVar6].type & 0x1f) & 1) == 0)))) goto LAB_001124c8;
            wVar7 = shapetypes[uVar1].form_b + L'\x03';
          }
          else {
            if ((lVar3 == 0) ||
               (((uVar6 = *(int *)((long)line + lVar3 + -8) - 0x621, 0xb1 < uVar6 ||
                 (4 < (byte)shapetypes[uVar6].type)) ||
                ((0x16U >> ((byte)shapetypes[uVar6].type & 0x1f) & 1) == 0)))) goto LAB_00112538;
            wVar7 = shapetypes[uVar1].form_b + L'\x02';
          }
          goto LAB_0011253d;
        }
        switch(*(undefined4 *)((long)line + lVar3 + -8)) {
        case 0x622:
          uVar10 = 0xfef5;
          puVar8 = &DAT_00126410;
          break;
        case 0x623:
          uVar10 = 0xfef7;
          puVar8 = &DAT_00126424;
          break;
        default:
          goto switchD_001124ec_caseD_624;
        case 0x625:
          uVar10 = 0xfef9;
          puVar8 = &DAT_00126438;
          break;
        case 0x627:
          uVar10 = 0xfefb;
          puVar8 = &DAT_0012644c;
        }
        if (uVar6 < 5) {
          uVar10 = *(undefined4 *)(puVar8 + (long)(int)uVar6 * 4);
        }
        *(undefined4 *)((long)&to->wc + lVar3) = uVar10;
        lVar11 = -8;
        wVar7 = L' ';
      }
      else {
        if (shapetypes[uVar1].type != '\x01') goto LAB_00112547;
        if (((wVar5 < count) && (uVar6 = *(int *)((long)&line[1].wc + lVar3) - 0x621, uVar6 < 0xb2))
           && (((byte)shapetypes[uVar6].type < 5 &&
               ((0x15U >> ((byte)shapetypes[uVar6].type & 0x1f) & 1) != 0)))) {
LAB_001124c8:
          wVar7 = shapetypes[uVar1].form_b + L'\x01';
        }
        else {
LAB_00112538:
          wVar7 = shapetypes[uVar1].form_b;
        }
LAB_0011253d:
        lVar11 = 4;
      }
      *(wchar_t *)((long)&to->origwc + lVar3 + lVar11) = wVar7;
    }
LAB_00112547:
    lVar3 = lVar3 + 0xc;
    wVar5 = wVar5 + L'\x01';
  } while( true );
}

Assistant:

int do_shape(bidi_char *line, bidi_char *to, int count)
{
    int i, tempShape;
    bool ligFlag = false;

    for (i=0; i<count; i++) {
        to[i] = line[i];
        tempShape = STYPE(line[i].wc);
        switch (tempShape) {
          case SC:
            break;

          case SU:
            break;

          case SR:
            tempShape = (i+1 < count ? STYPE(line[i+1].wc) : SU);
            if ((tempShape == SL) || (tempShape == SD) || (tempShape == SC))
                to[i].wc = SFINAL((SISOLATED(line[i].wc)));
            else
                to[i].wc = SISOLATED(line[i].wc);
            break;


          case SD:
            /* Make Ligatures */
            tempShape = (i+1 < count ? STYPE(line[i+1].wc) : SU);
            if (line[i].wc == 0x644) {
                if (i > 0) switch (line[i-1].wc) {
                  case 0x622:
                    ligFlag = true;
                    if ((tempShape == SL) || (tempShape == SD) || (tempShape == SC))
                        to[i].wc = 0xFEF6;
                    else
                        to[i].wc = 0xFEF5;
                    break;
                  case 0x623:
                    ligFlag = true;
                    if ((tempShape == SL) || (tempShape == SD) || (tempShape == SC))
                        to[i].wc = 0xFEF8;
                    else
                        to[i].wc = 0xFEF7;
                    break;
                  case 0x625:
                    ligFlag = true;
                    if ((tempShape == SL) || (tempShape == SD) || (tempShape == SC))
                        to[i].wc = 0xFEFA;
                    else
                        to[i].wc = 0xFEF9;
                    break;
                  case 0x627:
                    ligFlag = true;
                    if ((tempShape == SL) || (tempShape == SD) || (tempShape == SC))
                        to[i].wc = 0xFEFC;
                    else
                        to[i].wc = 0xFEFB;
                    break;
                }
                if (ligFlag) {
                    to[i-1].wc = 0x20;
                    ligFlag = false;
                    break;
                }
            }

            if ((tempShape == SL) || (tempShape == SD) || (tempShape == SC)) {
                tempShape = (i > 0 ? STYPE(line[i-1].wc) : SU);
                if ((tempShape == SR) || (tempShape == SD) || (tempShape == SC))
                    to[i].wc = SMEDIAL((SISOLATED(line[i].wc)));
                else
                    to[i].wc = SFINAL((SISOLATED(line[i].wc)));
                break;
            }

            tempShape = (i > 0 ? STYPE(line[i-1].wc) : SU);
            if ((tempShape == SR) || (tempShape == SD) || (tempShape == SC))
                to[i].wc = SINITIAL((SISOLATED(line[i].wc)));
            else
                to[i].wc = SISOLATED(line[i].wc);
            break;


        }
    }
    return 1;
}